

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  _Bool _Var1;
  _Bool _Var2;
  size_t n;
  long lVar3;
  size_t n_1;
  byte bVar4;
  ulong uVar5;
  _Bool sum [8];
  _Bool b [8];
  _Bool a [8];
  byte abStack_21 [9];
  _Bool local_18 [8];
  _Bool local_10 [8];
  
  bVar4 = 0;
  printf("Please enter a and b as %d-bit binary numbers\n",8);
  input_binary(local_10,8,"a = ");
  input_binary(local_18,8,"b = ");
  lVar3 = 0;
  do {
    _Var1 = local_10[lVar3];
    _Var2 = local_18[lVar3];
    abStack_21[lVar3 + 1] = (bVar4 ^ _Var2 != _Var1) & 1;
    bVar4 = bVar4 & _Var2 != _Var1;
    if (_Var1 == true && bVar4 == 0) {
      bVar4 = local_18[lVar3];
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  printf(anon_var_dwarf_6d);
  if (bVar4 != 0) {
    putchar(0x31);
  }
  lVar3 = 8;
  do {
    putchar(abStack_21[lVar3] | 0x30);
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  putchar(10);
  lVar3 = 0;
  uVar5 = 0;
  do {
    uVar5 = uVar5 | (ulong)abStack_21[lVar3 + 1] << ((byte)lVar3 & 0x3f);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  printf("  = %lu\n",uVar5);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  bool a[N_BITS];
  bool b[N_BITS];
  bool sum[N_BITS];

  // Input the numbers
  printf("Please enter a and b as %d-bit binary numbers\n", N_BITS);
  input_binary(a, N_BITS, "a = ");
  input_binary(b, N_BITS, "b = ");
  bool overflow = sum_binary(a, b, N_BITS, sum);

  printf("\u03a3 = ");
  // Print the carry bit if necessary
  if (overflow) printf("1");
  // Print each bit (back in big endian)
  for (size_t n = 0; n < N_BITS; n++) {
    printf("%c", sum[N_BITS - n - 1] ? '1' : '0');
  }
  printf("\n");

#if N_BITS <= 64
  // Convert the number in base 10
  uint64_t sum_b10 = 0;
  for (size_t n = 0; n < N_BITS; n++) {
    sum_b10 |= (uint64_t)sum[n] << n;
  }
  printf("  = %" PRIu64 "\n", sum_b10);
#endif

  return 0;
}